

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O2

void __thiscall dpfb::Font::readFontName(Font *this)

{
  ConstMemStream *this_00;
  string *psVar1;
  pointer pcVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  char16_t cVar11;
  uint32_t uVar12;
  int64_t offset;
  FontError *this_01;
  char16_t *in_RCX;
  char16_t *ch;
  pointer pcVar13;
  string *this_02;
  bool bVar14;
  vector<char16_t,_std::allocator<char16_t>_> utf16Name;
  string local_50;
  
  uVar12 = SfntOffsetTable::getTableOffset(&this->sfntOffsetTable,0x6e616d65);
  if (uVar12 == 0) {
    this_01 = (FontError *)__cxa_allocate_exception(0x10);
    FontError::runtime_error(this_01,"Font has no \"name\" table");
  }
  else {
    this_00 = &this->fontStream;
    streams::ConstMemStream::seek(this_00,(ulong)uVar12,set);
    uVar3 = streams::Stream::readU16Be(&this_00->super_Stream);
    if (uVar3 < 2) {
      uVar3 = streams::Stream::readU16Be(&this_00->super_Stream);
      if (uVar3 != 0) {
        uVar4 = streams::Stream::readU16Be(&this_00->super_Stream);
        psVar1 = &(this->fontName).style;
        while (bVar14 = uVar3 != 0, uVar3 = uVar3 - 1, bVar14) {
          uVar5 = streams::Stream::readU16Be(&this_00->super_Stream);
          uVar6 = streams::Stream::readU16Be(&this_00->super_Stream);
          uVar7 = streams::Stream::readU16Be(&this_00->super_Stream);
          uVar8 = streams::Stream::readU16Be(&this_00->super_Stream);
          uVar9 = streams::Stream::readU16Be(&this_00->super_Stream);
          uVar10 = streams::Stream::readU16Be(&this_00->super_Stream);
          in_RCX = (char16_t *)CONCAT71((int7)((ulong)in_RCX >> 8),uVar7 < 0x409 || uVar5 < 3);
          if (uVar7 >= 0x409 && uVar5 >= 3) {
            if ((((3 < uVar5) || (1 < uVar6)) || (0x409 < uVar7)) || (0x11 < uVar8)) break;
            this_02 = (string *)&(this->fontName).groupFamily;
            if (((uVar8 == 1) ||
                (in_RCX = (char16_t *)(ulong)uVar8, this_02 = (string *)psVar1, uVar8 == 0x11)) ||
               ((this_02 = (string *)&this->fontName, uVar8 == 0x10 ||
                (this_02 = (string *)psVar1, uVar8 == 2)))) {
              offset = streams::ConstMemStream::getPosition(this_00);
              streams::ConstMemStream::seek(this_00,(ulong)((uint)uVar10 + uVar12 + uVar4),set);
              utf16Name.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              utf16Name.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              utf16Name.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              std::vector<char16_t,_std::allocator<char16_t>_>::resize
                        (&utf16Name,(ulong)(uVar9 >> 1));
              pcVar2 = utf16Name.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (pcVar13 = utf16Name.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                             _M_impl.super__Vector_impl_data._M_start; pcVar13 != pcVar2;
                  pcVar13 = pcVar13 + 1) {
                cVar11 = streams::Stream::readU16Be(&this_00->super_Stream);
                *pcVar13 = cVar11;
              }
              unicode::utf16ToUtf8_abi_cxx11_
                        (&local_50,
                         (unicode *)
                         utf16Name.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         utf16Name.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                         super__Vector_impl_data._M_finish,in_RCX);
              std::__cxx11::string::operator=(this_02,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              streams::ConstMemStream::seek(this_00,offset,set);
              std::_Vector_base<char16_t,_std::allocator<char16_t>_>::~_Vector_base
                        (&utf16Name.super__Vector_base<char16_t,_std::allocator<char16_t>_>);
            }
          }
        }
        if ((this->fontName).family._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&this->fontName);
        }
        return;
      }
      this_01 = (FontError *)__cxa_allocate_exception(0x10);
      FontError::runtime_error(this_01,"\"name\" table has no records");
    }
    else {
      this_01 = (FontError *)__cxa_allocate_exception(0x10);
      FontError::runtime_error(this_01,"Invalid \"name\" table format");
    }
  }
  __cxa_throw(this_01,&FontError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Font::readFontName()
{
    const std::uint16_t platformIdWin = 3;
    const std::uint16_t languageIdWinEnglishUs = 0x0409;
    const std::uint16_t encodingIdWinUcs2 = 1;

    const auto tableOffset = sfntOffsetTable.getTableOffset(
        sfntTag('n', 'a', 'm', 'e'));
    if (tableOffset == 0)
        // "name" is a required table.
        throw FontError("Font has no \"name\" table");

    fontStream.seek(tableOffset, SeekOrigin::set);

    const auto format = fontStream.readU16Be();
    if (format != 0 && format != 1)
        throw FontError("Invalid \"name\" table format");

    auto count = fontStream.readU16Be();
    if (count == 0)
        throw FontError("\"name\" table has no records");

    const auto stringsOffset = fontStream.readU16Be();
    const auto storageOffset = tableOffset + stringsOffset;

    while (count--) {
        const auto platformId = fontStream.readU16Be();
        const auto encodingId = fontStream.readU16Be();
        const auto languageId = fontStream.readU16Be();
        const auto nameId = fontStream.readU16Be();
        const auto strByteLen = fontStream.readU16Be();
        const auto strOffset = fontStream.readU16Be();

        // We rely on the fact that name records are sorted.
        if (platformId < platformIdWin
                || languageId < languageIdWinEnglishUs)
            continue;
        else if (platformId > platformIdWin
                || encodingId > encodingIdWinUcs2
                || languageId > languageIdWinEnglishUs)
            break;

        if (nameId > 17)
            break;

        std::string* dst;
        switch (nameId) {
            case 1:
                dst = &fontName.groupFamily;
                break;
            case 2:
                dst = &fontName.style;
                break;
            case 16:  // Typographic Family
                dst = &fontName.family;
                break;
            case 17:  // Typographic Subfamily
                dst = &fontName.style;
                break;
            default:
                continue;
                break;
        }

        const auto pos = fontStream.getPosition();
        fontStream.seek(storageOffset + strOffset, SeekOrigin::set);

        std::vector<char16_t> utf16Name;
        utf16Name.resize(strByteLen / 2);
        for (auto& ch : utf16Name)
            ch = fontStream.readU16Be();

        *dst = unicode::utf16ToUtf8(
            utf16Name.data(), utf16Name.data() + utf16Name.size());

        fontStream.seek(pos, SeekOrigin::set);
    }

    // Fallback from id 16 to id 1. No need to do the same for
    // fontName.style (from id 17 to id 2) as it's done naturally
    // by ids order.
    if (fontName.family.empty())
        fontName.family = fontName.groupFamily;
}